

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmQtAutoGenGlobalInitializer.cxx
# Opt level: O3

void __thiscall
cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer
          (cmQtAutoGenGlobalInitializer *this,
          vector<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
          *localGenerators)

{
  _Rb_tree_header *p_Var1;
  cmMakefile *this_00;
  pointer pcVar2;
  cmLocalGenerator *pcVar3;
  __uniq_ptr_data<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>,_true,_true> _Var4;
  bool globalAutogenTarget;
  bool globalAutoRccTarget;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  TargetType TVar8;
  string *psVar9;
  const_iterator cVar10;
  string *psVar11;
  string *psVar12;
  cmQtAutoGenInitializer *this_01;
  bool moc;
  pointer puVar13;
  bool uic;
  ulong in_R8;
  pointer puVar14;
  byte bVar15;
  pointer puVar16;
  bool bVar17;
  bool bVar18;
  bool bVar19;
  initializer_list<std::pair<std::basic_string_view<char,_std::char_traits<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*>_>
  views;
  cmAlphaNum version;
  pair<cmQtAutoGen::IntegerVersion,_unsigned_int> local_228;
  _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
  *local_218;
  _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
  *local_210;
  pointer local_208;
  string targetName;
  string local_f8;
  string local_d8;
  string *local_b8;
  string *local_b0;
  string *local_a8;
  pointer local_a0;
  string *local_98;
  string *local_90;
  pointer local_88;
  string msg;
  _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_60;
  
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (this->Initializers_).
  super__Vector_base<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>,_std::allocator<std::unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_210 = (_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               *)&this->GlobalAutoGenTargets_;
  p_Var1 = &(this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoGenTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_218 = (_Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
               *)&this->GlobalAutoRccTargets_;
  p_Var1 = &(this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent =
       (_Base_ptr)0x0;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right =
       &p_Var1->_M_header;
  (this->GlobalAutoRccTargets_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  (this->CompilerFeatures_).Default._M_h._M_buckets =
       &(this->CompilerFeatures_).Default._M_h._M_single_bucket;
  (this->CompilerFeatures_).Default._M_h._M_bucket_count = 1;
  (this->CompilerFeatures_).Default._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CompilerFeatures_).Default._M_h._M_element_count = 0;
  (this->CompilerFeatures_).Default._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CompilerFeatures_).Default._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CompilerFeatures_).Default._M_h._M_single_bucket = (__node_base_ptr)0x0;
  (this->CompilerFeatures_).Config._M_h._M_buckets =
       &(this->CompilerFeatures_).Config._M_h._M_single_bucket;
  (this->CompilerFeatures_).Config._M_h._M_bucket_count = 1;
  (this->CompilerFeatures_).Config._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  (this->CompilerFeatures_).Config._M_h._M_element_count = 0;
  (this->CompilerFeatures_).Config._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  (this->CompilerFeatures_).Config._M_h._M_rehash_policy._M_next_resize = 0;
  (this->CompilerFeatures_).Config._M_h._M_single_bucket = (__node_base_ptr)0x0;
  Keywords::Keywords(&this->Keywords_);
  puVar16 = (localGenerators->
            super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
            )._M_impl.super__Vector_impl_data._M_start;
  local_a0 = (localGenerators->
             super__Vector_base<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>,_std::allocator<std::unique_ptr<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  if (puVar16 != local_a0) {
    local_90 = &(this->Keywords_).AUTOUIC;
    local_98 = &(this->Keywords_).AUTORCC;
    local_a8 = &(this->Keywords_).AUTOMOC_EXECUTABLE;
    local_b0 = &(this->Keywords_).AUTOUIC_EXECUTABLE;
    local_b8 = &(this->Keywords_).AUTORCC_EXECUTABLE;
    do {
      this_00 = ((puVar16->_M_t).
                 super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
                 super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl)->Makefile;
      targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetName,"CMAKE_GLOBAL_AUTOGEN_TARGET","");
      globalAutogenTarget = cmMakefile::IsOn(this_00,&targetName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetName._M_dataplus._M_p != &targetName.field_2) {
        operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
      }
      if (globalAutogenTarget) {
        version.RValueString_ = (string *)&version.View_._M_str;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&version,"CMAKE_GLOBAL_AUTOGEN_TARGET_NAME","");
        psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)&version);
        targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
        pcVar2 = (psVar9->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetName,pcVar2,pcVar2 + psVar9->_M_string_length);
        if (version.RValueString_ != (string *)&version.View_._M_str) {
          operator_delete(version.RValueString_,(ulong)(version.View_._M_str + 1));
        }
        if (targetName._M_string_length == 0) {
          in_R8 = 7;
          std::__cxx11::string::_M_replace((ulong)&targetName,0,(char *)0x0,0x821be3);
        }
        version.RValueString_ =
             (string *)
             (puVar16->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        std::
        _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
        ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                  (local_210,(cmLocalGenerator **)&version,&targetName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetName._M_dataplus._M_p != &targetName.field_2) {
          operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
        }
      }
      targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&targetName,"CMAKE_GLOBAL_AUTORCC_TARGET","");
      globalAutoRccTarget = cmMakefile::IsOn(this_00,&targetName);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)targetName._M_dataplus._M_p != &targetName.field_2) {
        operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
      }
      if (globalAutoRccTarget) {
        version.RValueString_ = (string *)&version.View_._M_str;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)&version,"CMAKE_GLOBAL_AUTORCC_TARGET_NAME","");
        psVar9 = cmMakefile::GetSafeDefinition(this_00,(string *)&version);
        targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
        pcVar2 = (psVar9->_M_dataplus)._M_p;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&targetName,pcVar2,pcVar2 + psVar9->_M_string_length);
        if (version.RValueString_ != (string *)&version.View_._M_str) {
          operator_delete(version.RValueString_,(ulong)(version.View_._M_str + 1));
        }
        if (targetName._M_string_length == 0) {
          in_R8 = 7;
          std::__cxx11::string::_M_replace((ulong)&targetName,0,(char *)0x0,0x821c61);
        }
        version.RValueString_ =
             (string *)
             (puVar16->_M_t).
             super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
             super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
             super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
        std::
        _Rb_tree<cmLocalGenerator*,std::pair<cmLocalGenerator*const,std::__cxx11::string>,std::_Select1st<std::pair<cmLocalGenerator*const,std::__cxx11::string>>,std::less<cmLocalGenerator*>,std::allocator<std::pair<cmLocalGenerator*const,std::__cxx11::string>>>
        ::_M_emplace_unique<cmLocalGenerator*,std::__cxx11::string>
                  (local_218,(cmLocalGenerator **)&version,&targetName);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)targetName._M_dataplus._M_p != &targetName.field_2) {
          operator_delete(targetName._M_dataplus._M_p,targetName.field_2._M_allocated_capacity + 1);
        }
      }
      pcVar3 = (puVar16->_M_t).
               super___uniq_ptr_impl<cmLocalGenerator,_std::default_delete<cmLocalGenerator>_>._M_t.
               super__Tuple_impl<0UL,_cmLocalGenerator_*,_std::default_delete<cmLocalGenerator>_>.
               super__Head_base<0UL,_cmLocalGenerator_*,_false>._M_head_impl;
      puVar14 = *(pointer *)
                 &(pcVar3->GeneratorTargets).
                  super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                  ._M_impl;
      puVar13 = *(pointer *)
                 ((long)&(pcVar3->GeneratorTargets).
                         super__Vector_base<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>,_std::allocator<std::unique_ptr<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>_>_>
                 + 8);
      local_208 = puVar13;
      local_88 = puVar16;
      if (puVar14 != puVar13) {
        do {
          TVar8 = cmGeneratorTarget::GetType
                            ((cmGeneratorTarget *)
                             (puVar14->_M_t).
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                            );
          if ((TVar8 < UTILITY) &&
             (bVar5 = cmGeneratorTarget::IsImported
                                ((cmGeneratorTarget *)
                                 (puVar14->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                ), !bVar5)) {
            cmGeneratorTarget::GetAllConfigCompileLanguages_abi_cxx11_
                      ((set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)&local_60,
                       (cmGeneratorTarget *)
                       (puVar14->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                      );
            cmGeneratorTarget::ClearSourcesCache
                      ((cmGeneratorTarget *)
                       (puVar14->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                      );
            targetName._M_dataplus._M_p = (pointer)&targetName.field_2;
            std::__cxx11::string::_M_construct<char_const*>((string *)&targetName,"CSharp","");
            cVar10 = std::
                     _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ::find(&local_60,&targetName);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)targetName._M_dataplus._M_p != &targetName.field_2) {
              operator_delete(targetName._M_dataplus._M_p,
                              targetName.field_2._M_allocated_capacity + 1);
            }
            puVar13 = local_208;
            if ((_Rb_tree_header *)cVar10._M_node == &local_60._M_impl.super__Rb_tree_header) {
              bVar5 = cmGeneratorTarget::GetPropertyAsBool
                                ((cmGeneratorTarget *)
                                 (puVar14->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 ,&(this->Keywords_).AUTOMOC);
              bVar6 = cmGeneratorTarget::GetPropertyAsBool
                                ((cmGeneratorTarget *)
                                 (puVar14->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 ,local_90);
              bVar7 = cmGeneratorTarget::GetPropertyAsBool
                                ((cmGeneratorTarget *)
                                 (puVar14->_M_t).
                                 super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                 ,local_98);
              if ((bVar5 || bVar6) || bVar7) {
                psVar9 = cmGeneratorTarget::GetSafeProperty
                                   ((cmGeneratorTarget *)
                                    (puVar14->_M_t).
                                    super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                    ,local_a8);
                psVar11 = cmGeneratorTarget::GetSafeProperty
                                    ((cmGeneratorTarget *)
                                     (puVar14->_M_t).
                                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                     ,local_b0);
                psVar12 = cmGeneratorTarget::GetSafeProperty
                                    ((cmGeneratorTarget *)
                                     (puVar14->_M_t).
                                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                     ,local_b8);
                _Var4.
                super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                _M_t.
                super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                     (puVar14->_M_t).
                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                ;
                local_d8._M_dataplus._M_p = (pointer)&local_d8.field_2;
                pcVar2 = (psVar9->_M_dataplus)._M_p;
                std::__cxx11::string::_M_construct<char*>
                          ((string *)&local_d8,pcVar2,pcVar2 + psVar9->_M_string_length);
                local_228 = cmQtAutoGenInitializer::GetQtVersion
                                      ((cmGeneratorTarget *)
                                       _Var4.
                                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                       ._M_t.
                                       super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                                       .super__Head_base<0UL,_cmGeneratorTarget_*,_false>.
                                       _M_head_impl,&local_d8);
                if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                     *)local_d8._M_dataplus._M_p != &local_d8.field_2) {
                  operator_delete(local_d8._M_dataplus._M_p,
                                  local_d8.field_2._M_allocated_capacity + 1);
                }
                bVar18 = true;
                bVar17 = true;
                bVar19 = true;
                if (2 < local_228.first.Major - 4) {
                  bVar17 = psVar9->_M_string_length != 0;
                  bVar18 = psVar11->_M_string_length != 0;
                  bVar19 = psVar12->_M_string_length != 0;
                }
                bVar15 = (bVar17 ^ 1U) & bVar5;
                moc = (bool)((bVar18 ^ 1U) & bVar6);
                uic = (bool)((bVar19 ^ 1U) & bVar7);
                if (((moc != false) || (bVar15 != 0)) || (uic != false)) {
                  if (local_228.second == 0) {
                    version.RValueString_ = (string *)0x0;
                    version.View_._M_len = 0xb;
                    version.View_._M_str = "<QTVERSION>";
                  }
                  else {
                    cmAlphaNum::cmAlphaNum(&version,local_228.second);
                  }
                  psVar9 = cmGeneratorTarget::GetName_abi_cxx11_
                                     ((cmGeneratorTarget *)
                                      (puVar14->_M_t).
                                      super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                                     );
                  cmQtAutoGen::Tools_abi_cxx11_
                            (&local_f8,(cmQtAutoGen *)(ulong)bVar15,moc,uic,SUB81(in_R8,0));
                  targetName._M_dataplus._M_p = (pointer)0x2e;
                  targetName._M_string_length = (size_type)anon_var_dwarf_887f93;
                  targetName.field_2._M_allocated_capacity = 0;
                  targetName.field_2._8_8_ = psVar9->_M_string_length;
                  views._M_len = 0xb;
                  views._M_array = (iterator)&targetName;
                  cmCatViews(&msg,views);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)local_f8._M_dataplus._M_p != &local_f8.field_2) {
                    operator_delete(local_f8._M_dataplus._M_p,
                                    local_f8.field_2._M_allocated_capacity + 1);
                  }
                  cmMakefile::IssueMessage
                            (*(cmMakefile **)
                              ((long)(puVar14->_M_t).
                                     super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                              + 8),AUTHOR_WARNING,&msg);
                  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                       *)msg._M_dataplus._M_p != &msg.field_2) {
                    operator_delete(msg._M_dataplus._M_p,msg.field_2._M_allocated_capacity + 1);
                  }
                }
                bVar5 = (bool)(bVar5 & bVar17);
                puVar13 = local_208;
                if ((byte)(bVar6 & bVar18 | bVar5 | bVar7 & bVar19) == 1) {
                  _Var4.
                  super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>.
                  _M_t.
                  super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                  .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl =
                       (puVar14->_M_t).
                       super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                  ;
                  this_01 = (cmQtAutoGenInitializer *)operator_new(0xb10);
                  in_R8 = (ulong)bVar5;
                  cmQtAutoGenInitializer::cmQtAutoGenInitializer
                            (this_01,this,
                             (cmGeneratorTarget *)
                             _Var4.
                             super___uniq_ptr_impl<cmGeneratorTarget,_std::default_delete<cmGeneratorTarget>_>
                             ._M_t.
                             super__Tuple_impl<0UL,_cmGeneratorTarget_*,_std::default_delete<cmGeneratorTarget>_>
                             .super__Head_base<0UL,_cmGeneratorTarget_*,_false>._M_head_impl,
                             &local_228.first,bVar5,(bool)(bVar6 & bVar18),(bool)(bVar7 & bVar19),
                             globalAutogenTarget,globalAutoRccTarget);
                  targetName._M_dataplus._M_p = (pointer)this_01;
                  std::
                  vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                  ::
                  emplace_back<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>
                            ((vector<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>,std::allocator<std::unique_ptr<cmQtAutoGenInitializer,std::default_delete<cmQtAutoGenInitializer>>>>
                              *)this,(unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                                      *)&targetName);
                  std::
                  unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>::
                  ~unique_ptr((unique_ptr<cmQtAutoGenInitializer,_std::default_delete<cmQtAutoGenInitializer>_>
                               *)&targetName);
                  puVar13 = local_208;
                }
              }
            }
            std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::_Identity<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::~_Rb_tree(&local_60);
          }
          puVar14 = puVar14 + 1;
        } while (puVar14 != puVar13);
      }
      puVar16 = local_88 + 1;
    } while (puVar16 != local_a0);
  }
  return;
}

Assistant:

cmQtAutoGenGlobalInitializer::cmQtAutoGenGlobalInitializer(
  std::vector<std::unique_ptr<cmLocalGenerator>> const& localGenerators)
{
  for (const auto& localGen : localGenerators) {
    // Detect global autogen and autorcc target names
    bool globalAutoGenTarget = false;
    bool globalAutoRccTarget = false;
    {
      cmMakefile const* makefile = localGen->GetMakefile();
      // Detect global autogen target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTOGEN_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTOGEN_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autogen";
        }
        this->GlobalAutoGenTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoGenTarget = true;
      }

      // Detect global autorcc target name
      if (makefile->IsOn("CMAKE_GLOBAL_AUTORCC_TARGET")) {
        std::string targetName =
          makefile->GetSafeDefinition("CMAKE_GLOBAL_AUTORCC_TARGET_NAME");
        if (targetName.empty()) {
          targetName = "autorcc";
        }
        this->GlobalAutoRccTargets_.emplace(localGen.get(),
                                            std::move(targetName));
        globalAutoRccTarget = true;
      }
    }

    // Find targets that require AUTOMOC/UIC/RCC processing
    for (const auto& target : localGen->GetGeneratorTargets()) {
      // Process only certain target types
      switch (target->GetType()) {
        case cmStateEnums::EXECUTABLE:
        case cmStateEnums::STATIC_LIBRARY:
        case cmStateEnums::SHARED_LIBRARY:
        case cmStateEnums::MODULE_LIBRARY:
        case cmStateEnums::OBJECT_LIBRARY:
          // Process target
          break;
        default:
          // Don't process target
          continue;
      }
      if (target->IsImported()) {
        // Don't process target
        continue;
      }
      std::set<std::string> const& languages =
        target->GetAllConfigCompileLanguages();
      // cmGeneratorTarget::GetAllConfigCompileLanguages caches the target's
      // sources. Clear it so that OBJECT library targets that are AUTOGEN
      // initialized after this target get their added mocs_compilation.cpp
      // source acknowledged by this target.
      target->ClearSourcesCache();
      if (languages.count("CSharp")) {
        // Don't process target if it's a CSharp target
        continue;
      }

      bool const moc = target->GetPropertyAsBool(this->kw().AUTOMOC);
      bool const uic = target->GetPropertyAsBool(this->kw().AUTOUIC);
      bool const rcc = target->GetPropertyAsBool(this->kw().AUTORCC);
      if (moc || uic || rcc) {
        std::string const& mocExec =
          target->GetSafeProperty(this->kw().AUTOMOC_EXECUTABLE);
        std::string const& uicExec =
          target->GetSafeProperty(this->kw().AUTOUIC_EXECUTABLE);
        std::string const& rccExec =
          target->GetSafeProperty(this->kw().AUTORCC_EXECUTABLE);

        // We support Qt4, Qt5 and Qt6
        auto const qtVersion =
          cmQtAutoGenInitializer::GetQtVersion(target.get(), mocExec);
        bool const validQt = (qtVersion.first.Major == 4) ||
          (qtVersion.first.Major == 5) || (qtVersion.first.Major == 6);

        bool const mocAvailable = (validQt || !mocExec.empty());
        bool const uicAvailable = (validQt || !uicExec.empty());
        bool const rccAvailable = (validQt || !rccExec.empty());
        bool const mocIsValid = (moc && mocAvailable);
        bool const uicIsValid = (uic && uicAvailable);
        bool const rccIsValid = (rcc && rccAvailable);
        // Disabled AUTOMOC/UIC/RCC warning
        bool const mocDisabled = (moc && !mocAvailable);
        bool const uicDisabled = (uic && !uicAvailable);
        bool const rccDisabled = (rcc && !rccAvailable);
        if (mocDisabled || uicDisabled || rccDisabled) {
          cmAlphaNum version = (qtVersion.second == 0)
            ? cmAlphaNum("<QTVERSION>")
            : cmAlphaNum(qtVersion.second);
          cmAlphaNum component = uicDisabled ? "Widgets" : "Core";

          std::string const msg = cmStrCat(
            "AUTOGEN: No valid Qt version found for target ",
            target->GetName(), ".  ",
            cmQtAutoGen::Tools(mocDisabled, uicDisabled, rccDisabled),
            " disabled.  Consider adding:\n", "  find_package(Qt", version,
            " COMPONENTS ", component, ")\n", "to your CMakeLists.txt file.");
          target->Makefile->IssueMessage(MessageType::AUTHOR_WARNING, msg);
        }
        if (mocIsValid || uicIsValid || rccIsValid) {
          // Create autogen target initializer
          this->Initializers_.emplace_back(
            cm::make_unique<cmQtAutoGenInitializer>(
              this, target.get(), qtVersion.first, mocIsValid, uicIsValid,
              rccIsValid, globalAutoGenTarget, globalAutoRccTarget));
        }
      }
    }
  }
}